

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O2

void __thiscall
agge::tests::RendererTests::RenditionAdapterObeysHorizontalLimits(RendererTests *this)

{
  uint8_t covers [5];
  allocator local_e9;
  blender<unsigned_char,_unsigned_char> blender;
  adapter<agge::tests::mocks::bitmap<unsigned_char,_2UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
  r;
  bitmap<unsigned_char,_2UL,_0UL> bitmap;
  string local_78;
  uint8_t reference [30];
  LocationInfo local_30;
  
  covers[4] = 0xe1;
  covers[0] = 'Q';
  covers[1] = 0xff;
  covers[2] = '\x13';
  covers[3] = 0x90;
  blender.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  blender.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  blender.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mocks::bitmap<unsigned_char,_2UL,_0UL>::bitmap(&bitmap,8,3);
  r._blender = &blender;
  r._offset.dx = 0;
  r._offset.dy = 0;
  r._window.x1 = 0;
  r._window.y1 = 0;
  r._window.x2 = bitmap._width;
  r._window.y2 = bitmap._height;
  r._bitmap = &bitmap;
  renderer::
  adapter<agge::tests::mocks::bitmap<unsigned_char,_2UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
  ::set_y(&r,0);
  renderer::
  adapter<agge::tests::mocks::bitmap<unsigned_char,_2UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
  ::operator()(&r,-2,3,covers);
  renderer::
  adapter<agge::tests::mocks::bitmap<unsigned_char,_2UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
  ::operator()(&r,5,5,covers);
  renderer::
  adapter<agge::tests::mocks::bitmap<unsigned_char,_2UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
  ::set_y(&r,1);
  renderer::
  adapter<agge::tests::mocks::bitmap<unsigned_char,_2UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
  ::operator()(&r,-5,5,covers);
  renderer::
  adapter<agge::tests::mocks::bitmap<unsigned_char,_2UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
  ::operator()(&r,8,5,covers);
  renderer::
  adapter<agge::tests::mocks::bitmap<unsigned_char,_2UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
  ::set_y(&r,2);
  renderer::
  adapter<agge::tests::mocks::bitmap<unsigned_char,_2UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
  ::operator()(&r,-3,5,covers);
  renderer::
  adapter<agge::tests::mocks::bitmap<unsigned_char,_2UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
  ::operator()(&r,7,4,covers);
  reference[0x10] = '\0';
  reference[0x11] = '\0';
  reference[0x12] = '\0';
  reference[0x13] = '\0';
  reference[0x14] = 0x90;
  reference[0x15] = 0xe1;
  reference[0x16] = '\0';
  reference[0x17] = '\0';
  reference[0x18] = '\0';
  reference[0x19] = '\0';
  reference[0x1a] = '\0';
  reference[0x1b] = 'Q';
  reference[0x1c] = '\0';
  reference[0x1d] = '\0';
  reference[0] = '\x13';
  reference[1] = '\0';
  reference[2] = '\0';
  reference[3] = '\0';
  reference[4] = '\0';
  reference[5] = 'Q';
  reference[6] = 0xff;
  reference[7] = '\x13';
  reference[8] = '\0';
  reference[9] = '\0';
  reference[10] = '\0';
  reference[0xb] = '\0';
  reference[0xc] = '\0';
  reference[0xd] = '\0';
  reference[0xe] = '\0';
  reference[0xf] = '\0';
  std::__cxx11::string::string
            ((string *)&local_78,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,&local_e9);
  ut::LocationInfo::LocationInfo(&local_30,&local_78,0x2b1);
  ut::are_equal<unsigned_char,30ul,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (&reference,&bitmap.data,&local_30);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&bitmap);
  std::
  _Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ::~_Vector_base((_Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
                   *)&blender);
  return;
}

Assistant:

test( RenditionAdapterObeysHorizontalLimits )
			{
				// INIT
				uint8_t covers[] = { 0x51, 0xFF, 0x13, 0x90, 0xE1, };
				mocks::blender<uint8_t, uint8_t> blender;
				mocks::bitmap<uint8_t, 2> bitmap(8, 3);
				renderer::adapter< mocks::bitmap<uint8_t, 2>, mocks::blender<uint8_t, uint8_t> > r(bitmap, zero(), 0, blender);

				// ACT
				r.set_y(0);
				r(-2, 3, covers);
				r(5, 5, covers);
				
				r.set_y(1);
				r(-5, 5, covers);
				r(8, 5, covers);
				
				r.set_y(2);
				r(-3, 5, covers);
				r(7, 4, covers);

				// ASSERT
				uint8_t reference[] = {
					0x13, 0x00, 0x00, 0x00, 0x00, 0x51, 0xFF, 0x13, 0x00, 0x00,
					0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,	0x00, 0x00, 0x00,
					0x90, 0xE1, 0x00, 0x00, 0x00, 0x00, 0x00, 0x51, 0x00, 0x00,
				};

				assert_equal(reference, bitmap.data);
			}